

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O3

string * __thiscall
CoreML::componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container,string *sep)

{
  undefined8 *puVar1;
  const_iterator it;
  undefined8 *puVar2;
  ostringstream ss;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  puVar2 = *(undefined8 **)this;
  puVar1 = *(undefined8 **)(this + 8);
  if (puVar1 != puVar2 && -1 < (long)puVar1 - (long)puVar2) {
    if (puVar2 != puVar1 + -4) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,(char *)*puVar2,puVar2[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   (char *)(container->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                   (long)(container->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
        puVar2 = puVar2 + 4;
      } while (puVar2 != puVar1 + -4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(char *)*puVar2,puVar2[1]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string componentsJoinedBy(const Container& container, const std::string& sep) {
        auto ss = std::ostringstream();
        auto beg = std::begin(container);
        auto end = std::end(container);
        if (std::distance(beg, end) > 0) {
            auto it = beg;
            for (; it != end - 1; ++it) {
                ss << *it;
                ss << sep;
            }
            ss << *it;
        }
        return ss.str();
    }